

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int local_5c;
  byte local_56 [2];
  int size_2;
  uint8 bytes [10];
  int size;
  uint8 *end;
  uint8 *target;
  uint64 value_local;
  CodedOutputStream *this_local;
  int size_1;
  uint32 part2;
  uint32 part1;
  uint32 part0;
  
  if (this->buffer_size_ < 10) {
    local_5c = 0;
    for (target = (uint8 *)value; (uint8 *)0x7f < target; target = (uint8 *)((ulong)target >> 7)) {
      local_56[local_5c] = (byte)target & 0x7f | 0x80;
      local_5c = local_5c + 1;
    }
    local_56[local_5c] = (byte)target & 0x7f;
    WriteRaw(this,local_56,local_5c + 1);
    return;
  }
  pbVar1 = this->buffer_;
  uVar3 = (uint)value;
  uVar4 = (uint)(value >> 0x1c);
  bVar2 = (byte)(value >> 0x38);
  if (bVar2 == 0) {
    if (uVar4 != 0) {
      if (0x3fff < uVar4) {
        if (0x1fffff < uVar4) {
          this_local._0_4_ = 8;
          goto LAB_0022ff69;
        }
        this_local._0_4_ = 7;
        goto LAB_0022ff7d;
      }
      if (0x7f < uVar4) {
        this_local._0_4_ = 6;
        goto LAB_0022ff91;
      }
      this_local._0_4_ = 5;
      goto LAB_0022ffa5;
    }
    if (0x3fff < uVar3) {
      if (0x1fffff < uVar3) {
        this_local._0_4_ = 4;
        goto LAB_0022ffb6;
      }
      this_local._0_4_ = 3;
      goto LAB_0022ffca;
    }
    if (uVar3 < 0x80) {
      this_local._0_4_ = 1;
      goto LAB_0022fff2;
    }
    this_local._0_4_ = 2;
  }
  else {
    if (bVar2 < 0x80) {
      this_local._0_4_ = 9;
    }
    else {
      this_local._0_4_ = 10;
      pbVar1[9] = bVar2 >> 7 | 0x80;
    }
    pbVar1[8] = bVar2 | 0x80;
LAB_0022ff69:
    pbVar1[7] = (byte)(uVar4 >> 0x15) | 0x80;
LAB_0022ff7d:
    pbVar1[6] = (byte)(uVar4 >> 0xe) | 0x80;
LAB_0022ff91:
    pbVar1[5] = (byte)(uVar4 >> 7) | 0x80;
LAB_0022ffa5:
    pbVar1[4] = (byte)(value >> 0x1c) | 0x80;
LAB_0022ffb6:
    pbVar1[3] = (byte)(uVar3 >> 0x15) | 0x80;
LAB_0022ffca:
    pbVar1[2] = (byte)(uVar3 >> 0xe) | 0x80;
  }
  pbVar1[1] = (byte)(uVar3 >> 7) | 0x80;
LAB_0022fff2:
  *pbVar1 = (byte)value | 0x80;
  pbVar1[(int)this_local + -1] = pbVar1[(int)this_local + -1] & 0x7f;
  register0x00000000 = pbVar1 + (int)this_local;
  bytes._2_4_ = (int)register0x00000000 - (int)pbVar1;
  Advance(this,bytes._2_4_);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= kMaxVarintBytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;

    uint8* end = WriteVarint64ToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarintBytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}